

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_tran_huge_msg(char *scheme,size_t size)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  size_t j;
  int i;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_url *url;
  nng_msg *msg;
  char *buf;
  char *addr;
  nng_dialer d1;
  nng_listener l1;
  nng_socket s2;
  nng_socket s1;
  size_t size_local;
  char *scheme_local;
  
  memset(&l1,0,4);
  memset(&d1,0,4);
  memset((void *)((long)&addr + 4),0,4);
  memset(&addr,0,4);
  msg = (nng_msg *)nng_alloc(size);
  pcVar5 = strchr(scheme,0x36);
  if ((pcVar5 != (char *)0x0) && (_Var1 = nuts_has_ipv6(), !_Var1)) {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0x1cc,"No IPv6 support present");
    return;
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_huge_msg::nuts_addr_);
  buf = nuts_tran_huge_msg::nuts_addr_;
  nVar2 = nng_pair1_open((nng_socket *)&l1);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1ce,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar5,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_pair1_open((nng_socket *)&d1);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1cf,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar5,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_set_ms((nng_socket)l1.id,"send-timeout",5000);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1d0,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 5000)",pcVar5,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_set_ms((nng_socket)d1.id,"send-timeout",5000);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1d1,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 5000)",pcVar5,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",5000);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1d2,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 5000)",pcVar5,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_socket_set_ms((nng_socket)d1.id,"recv-timeout",5000);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1d3,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 5000)",pcVar5,nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_listen((nng_socket)l1.id,buf,(nng_listener *)((long)&addr + 4),0);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1d4,"%s: expected success, got %s (%d)","nng_listen(s1, addr, &l1, 0)"
                           ,pcVar5,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_listener_get_url(addr._4_4_,(nng_url **)&result__1);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1d5,"%s: expected success, got %s (%d)",
                           "nng_listener_get_url(l1, &url)",pcVar5,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_dial_url((nng_socket)d1.id,_result__1,(nng_dialer *)&addr,0);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1d6,"%s: expected success, got %s (%d)",
                           "nng_dial_url(s2, url, &d1, 0)",pcVar5,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    iVar3 = nng_listener_id(addr._4_4_);
    acutest_check_((uint)(0 < iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x1d7,"%s","nng_listener_id(l1) > 0");
    iVar3 = nng_dialer_id(addr._0_4_);
    acutest_check_((uint)(0 < iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x1d8,"%s","nng_dialer_id(d1) > 0");
    j._0_4_ = 0;
    while( true ) {
      if (4 < (int)j) {
        nVar2 = nng_socket_close((nng_socket)l1.id);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x1e8,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                               pcVar5,nVar2);
        if (iVar3 == 0) {
          acutest_abort_();
        }
        nVar2 = nng_socket_close((nng_socket)d1.id);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x1e9,"%s: expected success, got %s (%d)","nng_socket_close(s2)",
                               pcVar5,nVar2);
        if (iVar3 != 0) {
          nng_free(msg,size);
          return;
        }
        acutest_abort_();
      }
      for (_result__10 = 0; _result__10 < size; _result__10 = _result__10 + 1) {
        uVar4 = nng_random();
        *(char *)((long)msg->m_header_buf + _result__10) = (char)uVar4;
      }
      nVar2 = nng_send((nng_socket)l1.id,msg,size,0);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1dd,"%s: expected success, got %s (%d)","nng_send(s1, buf, size, 0)"
                             ,pcVar5,nVar2);
      if (iVar3 == 0) {
        acutest_abort_();
      }
      nVar2 = nng_recvmsg((nng_socket)d1.id,(nng_msg **)&url,0);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1de,"%s: expected success, got %s (%d)","nng_recvmsg(s2, &msg, 0)",
                             pcVar5,nVar2);
      if (iVar3 == 0) {
        acutest_abort_();
      }
      sVar6 = nng_msg_len((nng_msg *)url);
      acutest_check_((uint)(sVar6 == size),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x1df,"%s","nng_msg_len(msg) == size");
      pvVar7 = nng_msg_body((nng_msg *)url);
      iVar3 = memcmp(pvVar7,msg,size);
      acutest_check_((uint)(iVar3 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x1e0,"%s","memcmp(nng_msg_body(msg), buf, size) == 0");
      nng_msg_free((nng_msg *)url);
      nVar2 = nng_send((nng_socket)d1.id,msg,size,0);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1e2,"%s: expected success, got %s (%d)","nng_send(s2, buf, size, 0)"
                             ,pcVar5,nVar2);
      if (iVar3 == 0) break;
      nVar2 = nng_recvmsg((nng_socket)l1.id,(nng_msg **)&url,0);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1e3,"%s: expected success, got %s (%d)","nng_recvmsg(s1, &msg, 0)",
                             pcVar5,nVar2);
      if (iVar3 == 0) {
        acutest_abort_();
      }
      sVar6 = nng_msg_len((nng_msg *)url);
      acutest_check_((uint)(sVar6 == size),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x1e4,"%s","nng_msg_len(msg) == size");
      pvVar7 = nng_msg_body((nng_msg *)url);
      iVar3 = memcmp(pvVar7,msg,size);
      acutest_check_((uint)(iVar3 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x1e5,"%s","memcmp(nng_msg_body(msg), buf, size) == 0");
      nng_msg_free((nng_msg *)url);
      j._0_4_ = (int)j + 1;
    }
    acutest_abort_();
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_huge_msg(const char *scheme, size_t size)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	char          *buf;
	nng_msg       *msg;
	const nng_url *url;

	buf = nng_alloc(size);

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 5000));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	for (int i = 0; i < 5; i++) {
		for (size_t j = 0; j < size; j++) {
			buf[j] = nng_random() & 0xff;
		}
		NUTS_PASS(nng_send(s1, buf, size, 0));
		NUTS_PASS(nng_recvmsg(s2, &msg, 0));
		NUTS_TRUE(nng_msg_len(msg) == size);
		NUTS_TRUE(memcmp(nng_msg_body(msg), buf, size) == 0);
		nng_msg_free(msg);
		NUTS_PASS(nng_send(s2, buf, size, 0));
		NUTS_PASS(nng_recvmsg(s1, &msg, 0));
		NUTS_TRUE(nng_msg_len(msg) == size);
		NUTS_TRUE(memcmp(nng_msg_body(msg), buf, size) == 0);
		nng_msg_free(msg);
	}
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	nng_free(buf, size);
}